

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O2

void __thiscall pg::TLSolver::TLSolver(TLSolver *this,Oink *oink,Game *game)

{
  undefined1 auVar1 [16];
  
  Solver::Solver(&this->super_Solver,oink,game);
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__TLSolver_0019daa0;
  (this->pea_state).pointer = 0;
  (this->pea_state).queue = (uint *)0x0;
  (this->pea_S).pointer = 0;
  (this->pea_S).queue = (uint *)0x0;
  this->pea_root = (bitset)ZEXT1632(auVar1);
  *(undefined1 (*) [32])&this->iterations = ZEXT1632(auVar1);
  (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->Q).queue + 4) = 0;
  (this->tangleto).pointer = 0;
  this->tangle = (vector<int,_std::allocator<int>_>)SUB3224(ZEXT1632(auVar1),0);
  (this->tangleto).queue = (uint *)SUB328(ZEXT1632(auVar1),0x18);
  (this->W)._bits = (uint64_t *)0x0;
  (this->W)._size = 0;
  (this->W)._bitssize = 0;
  (this->W)._allocsize = 0;
  (this->Even)._bits = (uint64_t *)0x0;
  (this->Even)._size = 0;
  (this->Even)._bitssize = 0;
  (this->Even)._allocsize = 0;
  (this->escapes)._bits = (uint64_t *)0x0;
  (this->escapes)._size = 0;
  (this->escapes)._bitssize = 0;
  (this->escapes)._allocsize = 0;
  (this->R)._bits = (uint64_t *)0x0;
  (this->R)._size = 0;
  (this->R)._bitssize = 0;
  (this->R)._allocsize = 0;
  (this->Z)._bits = (uint64_t *)0x0;
  (this->Z)._size = 0;
  (this->Z)._bitssize = 0;
  (this->Z)._allocsize = 0;
  (this->G)._bits = (uint64_t *)0x0;
  (this->G)._size = 0;
  (this->G)._bitssize = 0;
  (this->G)._allocsize = 0;
  (this->S)._bits = (uint64_t *)0x0;
  (this->S)._size = 0;
  (this->S)._bitssize = 0;
  (this->S)._allocsize = 0;
  (this->V)._bits = (uint64_t *)0x0;
  (this->V)._size = 0;
  (this->V)._bitssize = 0;
  (this->V)._allocsize = 0;
  (this->Even)._bits = (uint64_t *)0x0;
  (this->Even)._size = 0;
  (this->Even)._bitssize = 0;
  (this->Even)._allocsize = 0;
  (this->Odd)._bits = (uint64_t *)0x0;
  (this->Odd)._size = 0;
  (this->Odd)._bitssize = 0;
  (this->Odd)._allocsize = 0;
  return;
}

Assistant:

TLSolver::TLSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}